

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall
FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum,DThinker *prev)

{
  DThinker *prev_local;
  int statnum_local;
  PClass *type_local;
  FThinkerIterator *this_local;
  
  if ((uint)statnum < 0x80) {
    this->m_Stat = (BYTE)statnum;
    this->m_SearchStats = false;
  }
  else {
    this->m_Stat = ' ';
    this->m_SearchStats = true;
  }
  this->m_ParentType = type;
  if ((prev == (DThinker *)0x0) || (((prev->NextThinker->super_DObject).ObjectFlags & 0x400) != 0))
  {
    Reinit(this);
  }
  else {
    this->m_CurrThinker = prev->NextThinker;
    this->m_SearchingFresh = false;
  }
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum, DThinker *prev)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	if (prev == NULL || (prev->NextThinker->ObjectFlags & OF_Sentinel))
	{
		Reinit();
	}
	else
	{
		m_CurrThinker = prev->NextThinker;
		m_SearchingFresh = false;
	}
}